

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::sortMinUp
          (cbtAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,cbtDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  int *piVar2;
  cbtOverlappingPairCallback *pcVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  Edge EVar9;
  uint uVar10;
  Handle *handle1;
  Handle *pHVar11;
  Handle *pHVar12;
  Edge *pEVar13;
  
  lVar7 = (long)axis;
  uVar4 = this->m_pEdges[lVar7][(ulong)edge + 1].m_handle;
  if (uVar4 != 0) {
    pEVar13 = this->m_pEdges[lVar7] + edge;
    EVar9.m_handle = 0;
    EVar9.m_pos = pEVar13->m_pos;
    uVar10 = 1 << (axis & 0x1fU) & 3;
    uVar8 = 1 << uVar10 & 3;
    piVar2 = (int *)((long)(&this->m_pHandles[pEVar13->m_handle].super_cbtBroadphaseProxy.m_aabbMax
                           + 1) + lVar7 * 4);
    do {
      if (EVar9.m_pos < pEVar13[1].m_pos) {
        return;
      }
      lVar6 = 0x34;
      pHVar11 = this->m_pHandles + uVar4;
      if (((((pEVar13[1].m_pos & 1) != 0) && (lVar6 = 0x40, updateOverlaps)) &&
          (pHVar12 = this->m_pHandles + pEVar13->m_handle,
          *(uint *)((long)(&(pHVar11->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar10 * 4)
                   ) <= *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar10 * 4)))) &&
         (((*(uint *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) +
                     (ulong)(uVar10 * 4)) <=
            *(uint *)((long)pHVar11->m_maxEdges + (ulong)(uVar10 * 4)) &&
           (uVar5 = (ulong)(uVar8 * 4),
           *(uint *)((long)(&(pHVar11->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
           *(uint *)((long)pHVar12->m_maxEdges + uVar5))) &&
          (uVar5 = (ulong)(uVar8 * 4),
          *(uint *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
          *(uint *)((long)pHVar11->m_maxEdges + uVar5))))) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[3])
                  (this->m_pairCache,pHVar12,pHVar11);
        pcVar3 = this->m_userPairCallback;
        if (pcVar3 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar3->_vptr_cbtOverlappingPairCallback[3])(pcVar3,pHVar12,pHVar11,dispatcher);
        }
      }
      piVar1 = (int *)((long)(pHVar11->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                      lVar7 * 4 + lVar6 + -0x14);
      *piVar1 = *piVar1 + -1;
      *piVar2 = *piVar2 + 1;
      EVar9 = *pEVar13;
      *pEVar13 = pEVar13[1];
      pEVar13[1] = EVar9;
      uVar4 = pEVar13[2].m_handle;
      pEVar13 = pEVar13 + 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;

			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0, handle1, axis1, axis2)
#endif  //USE_OVERLAP_TEST_ON_REMOVES
			)
			{
				m_pairCache->removeOverlappingPair(handle0, handle1, dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0, handle1, dispatcher);
			}

			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}